

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandLine.cpp
# Opt level: O0

StringMap<llvm::cl::Option_*,_llvm::MallocAllocator> *
llvm::cl::getRegisteredOptions(SubCommand *Sub)

{
  bool bVar1;
  CommandLineParser *pCVar2;
  SubCommand *local_20;
  SmallPtrSet<llvm::cl::SubCommand_*,_4U> *local_18;
  SmallPtrSet<llvm::cl::SubCommand_*,_4U> *Subs;
  SubCommand *Sub_local;
  
  Subs = (SmallPtrSet<llvm::cl::SubCommand_*,_4U> *)Sub;
  pCVar2 = ManagedStatic<(anonymous_namespace)::CommandLineParser,_llvm::object_creator<(anonymous_namespace)::CommandLineParser>,_llvm::object_deleter<(anonymous_namespace)::CommandLineParser>_>
           ::operator->(&GlobalParser);
  local_18 = &pCVar2->RegisteredSubCommands;
  local_20 = (SubCommand *)Subs;
  bVar1 = is_contained<llvm::SmallPtrSet<llvm::cl::SubCommand*,4u>&,llvm::cl::SubCommand*>
                    (local_18,&local_20);
  if (!bVar1) {
    __assert_fail("is_contained(Subs, &Sub)",
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/CommandLine.cpp"
                  ,0x89a,"StringMap<Option *> &llvm::cl::getRegisteredOptions(SubCommand &)");
  }
  return (StringMap<llvm::cl::Option_*,_llvm::MallocAllocator> *)(Subs + 2);
}

Assistant:

StringMap<Option *> &cl::getRegisteredOptions(SubCommand &Sub) {
  auto &Subs = GlobalParser->RegisteredSubCommands;
  (void)Subs;
  assert(is_contained(Subs, &Sub));
  return Sub.OptionsMap;
}